

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dreadrb.c
# Opt level: O1

void dreadrb(int *nrow,int *ncol,int_t *nonz,double **nzval,int_t **rowind,int_t **colptr)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  int_t *addr;
  FILE *__stream;
  uint uVar4;
  byte *pbVar5;
  int_t *piVar6;
  int_t *piVar7;
  int_t *addr_00;
  void *addr_01;
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  double *pdVar15;
  double *pdVar16;
  long lVar17;
  double *addr_02;
  int_t *addr_03;
  byte *__nptr;
  long lVar18;
  int iVar19;
  double dVar20;
  int tmp;
  int rowsize;
  int rownum;
  int colsize;
  int colnum;
  char type [4];
  char buf_1 [100];
  char buf [100];
  int local_248;
  int local_21c;
  double **local_218;
  int_t **local_210;
  int_t **local_208;
  int_t *local_200;
  int_t *local_1f8;
  double *local_1f0;
  double *local_1e8;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  undefined1 local_1cc;
  byte local_1cb;
  undefined1 local_1c9;
  long local_1c8;
  int_t *local_1c0;
  ulong local_1b8;
  double *local_1b0;
  int_t *local_1a8;
  double *local_1a0;
  byte local_198 [256];
  byte local_98 [14];
  undefined1 local_8a;
  
  __stream = _stdin;
  local_218 = nzval;
  local_210 = rowind;
  local_208 = colptr;
  fgets((char *)local_98,100,_stdin);
  fputs((char *)local_98,_stdout);
  iVar19 = 4;
  iVar12 = 0;
  do {
    __isoc99_fscanf(__stream,"%14c",local_98);
    local_8a = 0;
    __isoc99_sscanf(local_98,"%d",&local_21c);
    if (iVar19 == 1) {
      iVar12 = local_21c;
    }
    iVar19 = iVar19 + -1;
  } while (iVar19 != 0);
  do {
    iVar19 = fgetc(__stream);
  } while (iVar19 != 10);
  __isoc99_fscanf(__stream,"%3c",&local_1cc);
  pbVar5 = local_98;
  __isoc99_fscanf(__stream,"%11c",pbVar5);
  local_1c9 = 0;
  __isoc99_fscanf(__stream,"%14c",pbVar5);
  iVar19 = atoi((char *)pbVar5);
  *nrow = iVar19;
  __isoc99_fscanf(__stream,"%14c",pbVar5);
  iVar19 = atoi((char *)pbVar5);
  *ncol = iVar19;
  __isoc99_fscanf(__stream,"%14c",pbVar5);
  iVar19 = atoi((char *)pbVar5);
  *nonz = iVar19;
  __isoc99_fscanf(__stream,"%14c",pbVar5);
  local_21c = atoi((char *)pbVar5);
  if (local_21c != 0) {
    puts("This is not an assembled matrix!");
  }
  if (*nrow != *ncol) {
    puts("Matrix is not square.");
  }
  do {
    iVar19 = fgetc(__stream);
  } while (iVar19 != 10);
  dallocateA(*ncol,*nonz,local_218,local_210,local_208);
  __isoc99_fscanf(__stream,"%16c",pbVar5);
  dParseIntFormat((char *)pbVar5,&local_1d0,&local_1d4);
  __isoc99_fscanf(__stream,"%16c",pbVar5);
  dParseIntFormat((char *)pbVar5,&local_1d8,&local_1dc);
  __isoc99_fscanf(__stream,"%20c",pbVar5);
  do {
    bVar2 = *pbVar5;
    pbVar5 = pbVar5 + 1;
  } while (bVar2 != 0x28);
  local_248 = atoi((char *)pbVar5);
  while( true ) {
    do {
      __nptr = pbVar5 + 1;
      uVar4 = *pbVar5 - 0x44;
      pbVar5 = __nptr;
    } while (0x2c < uVar4);
    if ((0x700000007U >> ((ulong)uVar4 & 0x3f) & 1) != 0) break;
    if ((0x100000001000U >> ((ulong)uVar4 & 0x3f) & 1) != 0) {
      local_248 = atoi((char *)__nptr);
    }
  }
  for (; (*pbVar5 != 0x29 && (*pbVar5 != 0x2e)); pbVar5 = pbVar5 + 1) {
  }
  *pbVar5 = 0;
  uVar4 = atoi((char *)__nptr);
  do {
    iVar19 = fgetc(__stream);
  } while (iVar19 != 10);
  ReadVector((FILE *)__stream,*ncol + 1,*local_208,local_1d0,local_1d4);
  ReadVector((FILE *)__stream,*nonz,*local_210,local_1d8,local_1dc);
  if (iVar12 != 0) {
    iVar12 = *nonz;
    if (0 < (long)iVar12) {
      local_1e8 = *local_218;
      local_1f0 = (double *)(long)local_248;
      lVar18 = 0;
      do {
        fgets((char *)local_198,100,__stream);
        if (0 < local_248) {
          lVar18 = (long)(int)lVar18;
          uVar11 = 0;
          lVar14 = 0;
          do {
            lVar1 = lVar14 + 1;
            lVar17 = lVar1 * (int)uVar4;
            bVar2 = local_198[lVar17];
            local_198[lVar17] = 0;
            if (0 < (int)uVar4) {
              uVar10 = 0;
              do {
                if ((local_198[uVar10 + uVar11] | 0x20) == 100) {
                  local_198[uVar10 + uVar11] = 0x45;
                }
                uVar10 = uVar10 + 1;
              } while (uVar4 != uVar10);
            }
            dVar20 = atof((char *)(local_198 + lVar14 * (int)uVar4));
            local_1e8[lVar18] = dVar20;
            lVar18 = lVar18 + 1;
            local_198[lVar17] = bVar2;
          } while ((lVar1 < (long)local_1f0) &&
                  (uVar11 = uVar11 + uVar4, lVar14 = lVar1, lVar18 < iVar12));
        }
      } while ((int)lVar18 < iVar12);
    }
  }
  if ((local_1cb & 0xdf) != 0x53) goto LAB_001057bc;
  uVar4 = *ncol;
  uVar10 = (ulong)uVar4;
  addr_03 = *local_210;
  addr = *local_208;
  addr_02 = *local_218;
  iVar12 = uVar4 + 1;
  piVar6 = intMalloc(iVar12);
  if (piVar6 == (int_t *)0x0) {
    sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker[]",0xc9,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadrb.c");
    superlu_abort_and_exit((char *)local_198);
  }
  piVar7 = intMalloc(iVar12);
  if (piVar7 == (int_t *)0x0) {
    sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC t_colptr[]",0xcb,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadrb.c");
    superlu_abort_and_exit((char *)local_198);
  }
  addr_00 = intMalloc(*nonz);
  if (addr_00 == (int_t *)0x0) {
    sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_rowind[]",
            0xcd,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadrb.c");
    superlu_abort_and_exit((char *)local_198);
  }
  addr_01 = superlu_malloc((long)*nonz << 3);
  if (addr_01 == (void *)0x0) {
    sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_val[]",0xcf,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadrb.c");
    superlu_abort_and_exit((char *)local_198);
  }
  local_200 = piVar7;
  if ((int)uVar4 < 1) {
    *piVar7 = 0;
LAB_00105454:
    if (0 < (int)uVar4) {
      uVar9 = 0;
      do {
        lVar18 = (long)addr[uVar9];
        uVar13 = uVar9 + 1;
        if (addr[uVar9] < addr[uVar9 + 1]) {
          do {
            iVar19 = addr_03[lVar18];
            addr_00[piVar6[iVar19]] = (int_t)uVar9;
            iVar3 = piVar6[iVar19];
            *(double *)((long)addr_01 + (long)iVar3 * 8) = addr_02[lVar18];
            piVar6[iVar19] = iVar3 + 1;
            lVar18 = lVar18 + 1;
          } while (lVar18 < addr[uVar13]);
        }
        uVar9 = uVar13;
      } while (uVar13 != uVar10);
    }
  }
  else {
    memset(piVar6,0,uVar10 * 4);
    uVar9 = 0;
    do {
      lVar18 = (long)addr[uVar9];
      uVar13 = uVar9 + 1;
      if (addr[uVar9] < addr[uVar9 + 1]) {
        do {
          piVar6[addr_03[lVar18]] = piVar6[addr_03[lVar18]] + 1;
          lVar18 = lVar18 + 1;
        } while (lVar18 < addr[uVar13]);
      }
      uVar9 = uVar13;
    } while (uVar13 != uVar10);
    *local_200 = 0;
    if (0 < (int)uVar4) {
      uVar9 = 0;
      do {
        local_200[uVar9 + 1] = piVar6[uVar9] + local_200[uVar9];
        piVar6[uVar9] = local_200[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
      goto LAB_00105454;
    }
  }
  piVar7 = local_200;
  lVar18 = (long)*nonz * 2 - (long)(int)uVar4;
  local_1f8 = intMalloc(iVar12);
  if (local_1f8 == (int_t *)0x0) {
    sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC a_colptr[]",0xe8,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadrb.c");
    superlu_abort_and_exit((char *)local_198);
  }
  local_1c0 = piVar6;
  piVar6 = intMalloc((int_t)lVar18);
  if (piVar6 == (int_t *)0x0) {
    sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_rowind[]",
            0xea,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadrb.c");
    superlu_abort_and_exit((char *)local_198);
  }
  local_1c8 = lVar18;
  pdVar8 = (double *)superlu_malloc(lVar18 * 8);
  if (pdVar8 == (double *)0x0) {
    sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_val[]",0xec,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadrb.c");
    superlu_abort_and_exit((char *)local_198);
  }
  *local_1f8 = 0;
  if (0 < (int)uVar4) {
    pdVar16 = (double *)0x0;
    uVar9 = 0;
    local_1b8 = uVar10;
    local_1b0 = addr_02;
    local_1a8 = addr_03;
    do {
      lVar18 = (long)piVar7[uVar9];
      uVar13 = uVar9 + 1;
      if (piVar7[uVar9] < piVar7[uVar9 + 1]) {
        do {
          if (uVar9 != (uint)addr_00[lVar18]) {
            iVar12 = (int)pdVar16;
            piVar6[iVar12] = addr_00[lVar18];
            pdVar8[iVar12] = *(double *)((long)addr_01 + lVar18 * 8);
            pdVar16 = (double *)(ulong)(iVar12 + 1);
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 < piVar7[uVar13]);
      }
      lVar18 = (long)addr[uVar9];
      if (addr[uVar9] < addr[uVar13]) {
        pdVar15 = pdVar8 + (int)pdVar16;
        lVar14 = 0;
        local_1f0 = pdVar15;
        local_1e8 = pdVar16;
        local_1a0 = pdVar16;
        do {
          piVar6[(int)pdVar16 + lVar14] = addr_03[lVar18 + lVar14];
          dVar20 = addr_02[lVar18 + lVar14];
          pdVar15[lVar14] = dVar20;
          if (ABS(dVar20) < 4.047e-300) {
            printf("%5d: %e\n",(ulong)(uint)((int)local_1e8 + (int)lVar14));
            pdVar15 = local_1f0;
          }
          lVar1 = lVar18 + lVar14;
          lVar14 = lVar14 + 1;
        } while (lVar1 + 1 < (long)addr[uVar13]);
        pdVar16 = (double *)(ulong)(uint)((int)local_1a0 + (int)lVar14);
        piVar7 = local_200;
        uVar10 = local_1b8;
        addr_02 = local_1b0;
        addr_03 = local_1a8;
      }
      local_1f8[uVar13] = (int_t)pdVar16;
      uVar9 = uVar13;
    } while (uVar13 != uVar10);
  }
  lVar18 = local_1c8;
  printf("FormFullA: new_nnz = %lld\n",local_1c8);
  superlu_free(addr_02);
  superlu_free(addr_03);
  superlu_free(addr);
  superlu_free(local_1c0);
  superlu_free(addr_01);
  superlu_free(addr_00);
  superlu_free(local_200);
  *local_218 = pdVar8;
  *local_210 = piVar6;
  *local_208 = local_1f8;
  *nonz = (int_t)lVar18;
LAB_001057bc:
  fclose(__stream);
  return;
}

Assistant:

void
dreadrb(int *nrow, int *ncol, int_t *nonz,
        double **nzval, int_t **rowind, int_t **colptr)
{

    register int i, numer_lines = 0;
    int tmp, colnum, colsize, rownum, rowsize, valnum, valsize;
    char buf[100], type[4];
    int sym;
    FILE *fp;

    fp = stdin;

    /* Line 1 */
    fgets(buf, 100, fp);
    fputs(buf, stdout);

    /* Line 2 */
    for (i=0; i<4; i++) {
        fscanf(fp, "%14c", buf); buf[14] = 0;
        sscanf(buf, "%d", &tmp);
        if (i == 3) numer_lines = tmp;
    }
    dDumpLine(fp);

    /* Line 3 */
    fscanf(fp, "%3c", type);
    fscanf(fp, "%11c", buf); /* pad */
    type[3] = 0;
#ifdef DEBUG
    printf("Matrix type %s\n", type);
#endif

    fscanf(fp, "%14c", buf); *nrow = atoi(buf);
    fscanf(fp, "%14c", buf); *ncol = atoi(buf);
    fscanf(fp, "%14c", buf); *nonz = atoi(buf);
    fscanf(fp, "%14c", buf); tmp = atoi(buf);

    if (tmp != 0)
        printf("This is not an assembled matrix!\n");
    if (*nrow != *ncol)
        printf("Matrix is not square.\n");
    dDumpLine(fp);

    /* Allocate storage for the three arrays ( nzval, rowind, colptr ) */
    dallocateA(*ncol, *nonz, nzval, rowind, colptr);

    /* Line 4: format statement */
    fscanf(fp, "%16c", buf);
    dParseIntFormat(buf, &colnum, &colsize);
    fscanf(fp, "%16c", buf);
    dParseIntFormat(buf, &rownum, &rowsize);
    fscanf(fp, "%20c", buf);
    dParseFloatFormat(buf, &valnum, &valsize);
    dDumpLine(fp);

#ifdef DEBUG
    printf("%d rows, %lld nonzeros\n", *nrow, (long long) *nonz);
    printf("colnum %d, colsize %d\n", colnum, colsize);
    printf("rownum %d, rowsize %d\n", rownum, rowsize);
    printf("valnum %d, valsize %d\n", valnum, valsize);
#endif

    ReadVector(fp, *ncol+1, *colptr, colnum, colsize);
    ReadVector(fp, *nonz, *rowind, rownum, rowsize);
    if ( numer_lines ) {
        dReadValues(fp, *nonz, *nzval, valnum, valsize);
    }

    sym = (type[1] == 'S' || type[1] == 's');
    if ( sym ) {
	FormFullA(*ncol, nonz, nzval, rowind, colptr);
    }

    fclose(fp);
}